

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitThrow
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Throw *curr)

{
  bool bVar1;
  value_type *other;
  Iterator IVar2;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar3;
  undefined1 local_f8 [8];
  value_type item;
  Iterator __end2;
  Iterator __begin2;
  Literals *__range2;
  WasmException exn;
  undefined1 local_58 [8];
  Literals arguments;
  Throw *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  Flow *flow;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)curr;
  Literals::Literals((Literals *)local_58);
  generateArguments(__return_storage_ptr__,this,
                    (ExpressionList *)
                    &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[1].field_0.func.super_IString.str.
                     _M_str,(Literals *)local_58);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (bVar1) {
    Literals::~Literals((Literals *)local_58);
    return __return_storage_ptr__;
  }
  WasmException::WasmException((WasmException *)&__range2);
  wasm::Name::operator=
            ((Name *)&__range2,
             (Name *)&(arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->type);
  IVar2 = SmallVector<wasm::Literal,_1UL>::begin((SmallVector<wasm::Literal,_1UL> *)local_58);
  __end2.
  super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  .index = (size_t)IVar2.
                   super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                   .parent;
  IVar3 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
           )SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)local_58);
  while( true ) {
    __end2.
    super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
    .parent = (SmallVector<wasm::Literal,_1UL> *)IVar3.index;
    item.type.id = (uintptr_t)IVar3.parent;
    bVar1 = SmallVector<wasm::Literal,_1UL>::
            IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                          *)&__end2.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .index,(Iterator *)&item.type);
    if (!bVar1) break;
    other = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                      ((Iterator *)
                       &__end2.
                        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                        .index);
    wasm::Literal::Literal((Literal *)local_f8,other);
    SmallVector<wasm::Literal,_1UL>::push_back
              ((SmallVector<wasm::Literal,_1UL> *)&exn.tag.super_IString.str._M_str,
               (Literal *)local_f8);
    wasm::Literal::~Literal((Literal *)local_f8);
    SmallVector<wasm::Literal,_1UL>::
    IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
    ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                  *)&__end2.
                     super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                     .index);
    IVar3.index = (size_t)__end2.
                          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                          .parent;
    IVar3.parent = (SmallVector<wasm::Literal,_1UL> *)item.type.id;
  }
  (*this->_vptr_ExpressionRunner[4])(this,&__range2);
  handle_unreachable("throw",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0x56c);
}

Assistant:

Flow visitThrow(Throw* curr) {
    NOTE_ENTER("Throw");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(curr->tag);
    WasmException exn;
    exn.tag = curr->tag;
    for (auto item : arguments) {
      exn.values.push_back(item);
    }
    throwException(exn);
    WASM_UNREACHABLE("throw");
  }